

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFboColorbufferTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles31::Functional::FboColorbufferCase::compare
          (FboColorbufferCase *this,Surface *reference,Surface *result)

{
  TestLog *log;
  uint uVar1;
  uint uVar2;
  bool bVar3;
  RGBA RVar4;
  ostream *poVar5;
  uint uVar6;
  void *pvVar7;
  uint uVar8;
  TextureFormat local_1e0;
  ConstPixelBufferAccess local_1d8;
  undefined1 local_1b0 [8];
  undefined1 local_1a8 [376];
  
  RVar4 = FboTestUtil::getFormatThreshold(this->m_format);
  uVar1 = RVar4.m_value & 0xff;
  if ((RVar4.m_value & 0xff) < 0xd) {
    uVar1 = 0xc;
  }
  uVar6 = RVar4.m_value >> 8 & 0xff;
  if (uVar6 < 0xd) {
    uVar6 = 0xc;
  }
  uVar8 = RVar4.m_value >> 0x10 & 0xff;
  if (uVar8 < 0xd) {
    uVar8 = 0xc;
  }
  uVar2 = RVar4.m_value >> 0x18;
  if (RVar4.m_value >> 0x18 < 0xd) {
    uVar2 = 0xc;
  }
  local_1b0 = (undefined1  [8])
              ((this->super_FboTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
              m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Comparing images, threshold: ",0x1d);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"RGBA(",5);
  poVar5 = (ostream *)std::ostream::operator<<(local_1a8,uVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  log = ((this->super_FboTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_1d8.m_format.order = RGBA;
  local_1d8.m_format.type = UNORM_INT8;
  pvVar7 = (void *)(reference->m_pixels).m_cap;
  if (pvVar7 != (void *)0x0) {
    pvVar7 = (reference->m_pixels).m_ptr;
  }
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)local_1b0,&local_1d8.m_format,reference->m_width,
             reference->m_height,1,pvVar7);
  local_1e0.order = RGBA;
  local_1e0.type = UNORM_INT8;
  pvVar7 = (void *)(result->m_pixels).m_cap;
  if (pvVar7 != (void *)0x0) {
    pvVar7 = (result->m_pixels).m_ptr;
  }
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&local_1d8,&local_1e0,result->m_width,result->m_height,1,pvVar7);
  bVar3 = tcu::bilinearCompare
                    (log,"Result","Image comparison result",(ConstPixelBufferAccess *)local_1b0,
                     &local_1d8,(RGBA)(uVar6 << 8 | uVar2 << 0x18 | uVar8 << 0x10 | uVar1),
                     COMPARE_LOG_RESULT);
  return bVar3;
}

Assistant:

bool compare (const tcu::Surface& reference, const tcu::Surface& result)
	{
		const tcu::RGBA threshold (tcu::max(getFormatThreshold(m_format), MIN_THRESHOLD));

		m_testCtx.getLog() << TestLog::Message << "Comparing images, threshold: " << threshold << TestLog::EndMessage;

		return tcu::bilinearCompare(m_testCtx.getLog(), "Result", "Image comparison result", reference.getAccess(), result.getAccess(), threshold, tcu::COMPARE_LOG_RESULT);
	}